

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_sse2.c
# Opt level: O3

void av1_resize_horz_dir_sse2
               (uint8_t *input,int in_stride,uint8_t *intbuf,int height,int filtered_length,
               int width2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  short sVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar27 [12];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [16];
  ushort uVar35;
  ushort uVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  if (filtered_length < 0x10) {
    av1_resize_horz_dir_c(input,in_stride,intbuf,height,filtered_length,width2);
    return;
  }
  if (0 < height) {
    lVar15 = (ulong)(filtered_length - 0x10) << 0x1f;
    lVar8 = 0;
    uVar16 = 0;
    auVar37 = _DAT_00525b00;
    auVar38 = _DAT_004dd7d0;
    auVar39 = _DAT_00525b20;
    auVar40 = _DAT_00525b10;
    do {
      lVar10 = uVar16 * (long)in_stride;
      iVar9 = 5;
      lVar12 = 0;
      uVar13 = 0;
      iVar14 = 0;
      lVar11 = lVar8;
      iVar7 = filtered_length;
      do {
        if ((iVar7 == 0x12) || (iVar7 == 0x14)) goto LAB_00381059;
        if (lVar15 == lVar12) {
          iVar9 = 0;
        }
        auVar17 = *(undefined1 (*) [16])(input + (iVar14 + (int)lVar11));
        if (lVar12 == 0) {
          auVar21 = ZEXT216(CONCAT11(input[lVar10],input[lVar10]));
          auVar20 = pshuflw(auVar21,auVar21,0);
          auVar21._0_8_ = auVar17._0_8_ << 0x18;
          auVar21._8_8_ = auVar17._8_8_ << 0x18 | auVar17._0_8_ >> 0x28;
          auVar17 = auVar21 | auVar20 & ZEXT416(0xffffff);
        }
        auVar27 = SUB1612(*(undefined1 (*) [16])(input + (iVar9 + (int)lVar11)),2);
        if (lVar15 == lVar12) {
          auVar21 = ZEXT216(CONCAT11(input[lVar10 + ((ulong)(uint)filtered_length - 1)],
                                     input[lVar10 + ((ulong)(uint)filtered_length - 1)]));
          auVar21 = pshuflw(auVar21,auVar21,0);
          auVar20._0_4_ = auVar21._0_4_;
          auVar20._4_4_ = auVar20._0_4_;
          auVar20._8_4_ = auVar20._0_4_;
          auVar20._12_4_ = auVar20._0_4_;
          auVar27 = SUB1612(*(undefined1 (*) [16])(input + (iVar9 + (int)lVar11)),4) >> 0x18 &
                    auVar37._2_12_ | ~auVar37._2_12_ & auVar20._2_12_;
        }
        auVar22._0_8_ = auVar17._2_8_;
        auVar22._8_8_ = auVar27._0_8_;
        auVar24._0_8_ = auVar17._4_8_;
        auVar24._8_8_ = auVar27._2_8_;
        auVar32._0_8_ = auVar17._6_8_;
        auVar32._8_8_ = auVar27._4_8_;
        uVar28 = auVar17._4_2_;
        uVar29 = auVar17._6_2_;
        uVar30 = auVar17._8_2_;
        uVar31 = auVar17._10_2_;
        uVar35 = auVar27._4_2_;
        uVar36 = auVar27._6_2_;
        auVar21 = auVar17 & auVar38;
        sVar19 = auVar21._6_2_ + (auVar17._12_2_ >> 8);
        auVar32 = auVar32 & auVar38;
        auVar22 = auVar22 & auVar38;
        sVar23 = auVar22._6_2_ + (uVar31 >> 8);
        auVar24 = auVar24 & auVar38;
        auVar25._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar32._6_2_ + (uVar29 >> 8),sVar19),
                                auVar32._4_2_ + (uVar28 >> 8)),
                       CONCAT22(auVar21._4_2_ + (uVar31 >> 8),sVar19)) >> 0x10);
        auVar25._6_2_ = auVar32._2_2_ + (auVar17._2_2_ >> 8);
        auVar25._4_2_ = auVar21._2_2_ + (uVar30 >> 8);
        auVar25._2_2_ = auVar32._0_2_ + (auVar17._0_2_ >> 8);
        auVar25._0_2_ = auVar21._0_2_ + (uVar29 >> 8);
        auVar33._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar24._6_2_ + (uVar30 >> 8),sVar23),
                                auVar24._4_2_ + (uVar29 >> 8)),
                       CONCAT22(auVar22._4_2_ + (uVar30 >> 8),sVar23)) >> 0x10);
        auVar33._6_2_ = auVar24._2_2_ + (uVar28 >> 8);
        auVar33._4_2_ = auVar22._2_2_ + (uVar29 >> 8);
        auVar33._2_2_ = auVar24._0_2_ + (auVar17._2_2_ >> 8);
        auVar33._0_2_ = auVar22._0_2_ + (uVar28 >> 8);
        auVar18._2_2_ = auVar32._8_2_ + (uVar30 >> 8);
        auVar18._0_2_ = auVar21._8_2_ + (uVar35 >> 8);
        auVar18._4_2_ = auVar21._10_2_ + (uVar36 >> 8);
        auVar18._6_2_ = auVar32._10_2_ + (uVar31 >> 8);
        auVar18._8_2_ = auVar21._12_2_ + (auVar27._8_2_ >> 8);
        auVar18._10_2_ = auVar32._12_2_ + (auVar17._12_2_ >> 8);
        auVar18._12_2_ = auVar21._14_2_ + (auVar27._10_2_ >> 8);
        auVar18._14_2_ = auVar32._14_2_ + (auVar17._14_2_ >> 8);
        auVar17._2_2_ = auVar24._8_2_ + (auVar27._0_2_ >> 8);
        auVar17._0_2_ = auVar22._8_2_ + (auVar27._2_2_ >> 8);
        auVar17._4_2_ = auVar22._10_2_ + (uVar35 >> 8);
        auVar17._6_2_ = auVar24._10_2_ + (auVar27._2_2_ >> 8);
        auVar17._8_2_ = auVar22._12_2_ + (uVar36 >> 8);
        auVar17._10_2_ = auVar24._12_2_ + (uVar35 >> 8);
        auVar17._12_2_ = auVar22._14_2_ + (auVar27._8_2_ >> 8);
        auVar17._14_2_ = auVar24._14_2_ + (uVar36 >> 8);
        auVar34 = pmaddwd(auVar33,auVar39);
        auVar20 = pmaddwd(auVar25,auVar40);
        auVar21 = pmaddwd(auVar17,auVar39);
        auVar17 = pmaddwd(auVar18,auVar40);
        auVar26._0_4_ = auVar20._0_4_ + auVar34._0_4_ + 0x40 >> 7;
        auVar26._4_4_ = auVar20._4_4_ + auVar34._4_4_ + 0x40 >> 7;
        auVar26._8_4_ = auVar20._8_4_ + auVar34._8_4_ + 0x40 >> 7;
        auVar26._12_4_ = auVar20._12_4_ + auVar34._12_4_ + 0x40 >> 7;
        auVar34._0_4_ = auVar17._0_4_ + auVar21._0_4_ + 0x40 >> 7;
        auVar34._4_4_ = auVar17._4_4_ + auVar21._4_4_ + 0x40 >> 7;
        auVar34._8_4_ = auVar17._8_4_ + auVar21._8_4_ + 0x40 >> 7;
        auVar34._12_4_ = auVar17._12_4_ + auVar21._12_4_ + 0x40 >> 7;
        auVar17 = packssdw(auVar26,auVar34);
        sVar19 = auVar17._0_2_;
        sVar23 = auVar17._2_2_;
        sVar1 = auVar17._4_2_;
        sVar2 = auVar17._6_2_;
        sVar3 = auVar17._8_2_;
        sVar4 = auVar17._10_2_;
        sVar5 = auVar17._12_2_;
        sVar6 = auVar17._14_2_;
        *(ulong *)(intbuf + (lVar12 >> 0x20) + uVar16 * (long)width2) =
             CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar17[0xe] - (0xff < sVar6),
                      CONCAT16((0 < sVar5) * (sVar5 < 0x100) * auVar17[0xc] - (0xff < sVar5),
                               CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar17[10] - (0xff < sVar4)
                                        ,CONCAT14((0 < sVar3) * (sVar3 < 0x100) * auVar17[8] -
                                                  (0xff < sVar3),
                                                  CONCAT13((0 < sVar2) * (sVar2 < 0x100) *
                                                           auVar17[6] - (0xff < sVar2),
                                                           CONCAT12((0 < sVar1) * (sVar1 < 0x100) *
                                                                    auVar17[4] - (0xff < sVar1),
                                                                    CONCAT11((0 < sVar23) *
                                                                             (sVar23 < 0x100) *
                                                                             auVar17[2] -
                                                                             (0xff < sVar23),
                                                                             (0 < sVar19) *
                                                                             (sVar19 < 0x100) *
                                                                             auVar17[0] -
                                                                             (0xff < sVar19))))))));
        uVar13 = uVar13 + 0x10;
        lVar12 = lVar12 + 0x800000000;
        lVar11 = lVar11 + 0x10;
        iVar7 = iVar7 + -0x10;
        iVar14 = -3;
      } while (uVar13 <= filtered_length - 0x10);
      if (iVar7 != 0) {
LAB_00381059:
        down2_symeven(input + lVar10,filtered_length,
                      intbuf + (long)((filtered_length - iVar7) / 2) + uVar16 * (long)width2,
                      filtered_length - iVar7);
        auVar37 = _DAT_00525b00;
        auVar38 = _DAT_004dd7d0;
        auVar39 = _DAT_00525b20;
        auVar40 = _DAT_00525b10;
      }
      uVar16 = uVar16 + 1;
      lVar8 = lVar8 + in_stride;
    } while (uVar16 != (uint)height);
  }
  return;
}

Assistant:

void av1_resize_horz_dir_sse2(const uint8_t *const input, int in_stride,
                              uint8_t *intbuf, int height, int filtered_length,
                              int width2) {
  assert(height % 2 == 0);
  // Invoke C for width less than 16.
  if (filtered_length < 16) {
    av1_resize_horz_dir_c(input, in_stride, intbuf, height, filtered_length,
                          width2);
    return;
  }

  __m128i coeffs_x[2];
  const int bits = FILTER_BITS;
  const int dst_stride = width2;
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const uint8_t max_pixel = 255;
  const __m128i clip_pixel = _mm_set1_epi8((char)max_pixel);
  const __m128i zero = _mm_setzero_si128();

  const __m128i start_pad_mask = _mm_loadu_si128((__m128i *)left_padding_mask);
  const __m128i end_pad_mask = _mm_loadu_si128((__m128i *)right_padding_mask);
  const __m128i mask_even = _mm_loadu_si128((__m128i *)mask_16);
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_x);

  for (int i = 0; i < height; ++i) {
    int filter_offset = 0;
    int row01_offset = ROW_OFFSET;
    int remain_col = filtered_length;
    // To avoid pixel over-read at frame boundary, processing of 16 pixels
    // is done using the core loop only if sufficient number of pixels required
    // for the load are present.The remaining pixels are processed separately.
    for (int j = 0; j <= filtered_length - 16; j += 16) {
      if (remain_col == 18 || remain_col == 20) {
        break;
      }
      const int is_last_cols16 = (j == filtered_length - 16);
      // While processing the last 16 pixels of the row, ensure that only valid
      // pixels are loaded.
      if (is_last_cols16) row01_offset = 0;
      const int in_idx = i * in_stride + j - filter_offset;
      const int out_idx = i * dst_stride + j / 2;
      remain_col -= 16;
      // a0 a1 a2 a3 .... a15
      __m128i row00 = _mm_loadu_si128((__m128i *)&input[in_idx]);
      // a8 a9 a10 a11 .... a23
      __m128i row01 = _mm_loadu_si128(
          (__m128i *)&input[in_idx + row01_offset + filter_offset]);
      filter_offset = 3;

      // Pad start pixels to the left, while processing the first pixels in the
      // row.
      if (j == 0) {
        const __m128i start_pixel_row0 =
            _mm_set1_epi8((char)input[i * in_stride]);
        row00 =
            blend(_mm_slli_si128(row00, 3), start_pixel_row0, start_pad_mask);
      }

      // Pad end pixels to the right, while processing the last pixels in the
      // row.
      if (is_last_cols16) {
        const __m128i end_pixel_row0 =
            _mm_set1_epi8((char)input[i * in_stride + filtered_length - 1]);
        row01 = blend(_mm_srli_si128(row01, ROW_OFFSET), end_pixel_row0,
                      end_pad_mask);
      }

      // a2 a3 a4 a5 a6 a7 a8 a9 .... a17
      const __m128i row0_1 = _mm_unpacklo_epi64(_mm_srli_si128(row00, 2),
                                                _mm_srli_si128(row01, 2));
      // a4 a5 a6 a7 a9 10 a11 a12 .... a19
      const __m128i row0_2 = _mm_unpacklo_epi64(_mm_srli_si128(row00, 4),
                                                _mm_srli_si128(row01, 4));
      // a6 a7 a8 a9 a10 a11 a12 a13 .... a21
      const __m128i row0_3 = _mm_unpacklo_epi64(_mm_srli_si128(row00, 6),
                                                _mm_srli_si128(row01, 6));

      // a0 a2 a4 a6 a8 a10 a12 a14 (each 16 bit)
      const __m128i s0 = _mm_and_si128(row00, mask_even);
      // a1 a3 a5 a7 a9 a11 a13 a15
      const __m128i s1 = _mm_and_si128(_mm_srli_epi16(row00, 8), mask_even);
      // a2 a4 a6 a8 a10 a12 a14 a16
      const __m128i s2 = _mm_and_si128(row0_1, mask_even);
      // a3 a5 a7 a9 a11 a13 a15 a17
      const __m128i s3 = _mm_and_si128(_mm_srli_epi16(row0_1, 8), mask_even);
      // a4 a6 a8 a10 a12 a14 a16 a18
      const __m128i s4 = _mm_and_si128(row0_2, mask_even);
      // a5 a7 a9 a11 a13 a15 a17 a19
      const __m128i s5 = _mm_and_si128(_mm_srli_epi16(row0_2, 8), mask_even);
      // a6 a8 a10 a12 a14 a16 a18 a20
      const __m128i s6 = _mm_and_si128(row0_3, mask_even);
      // a7 a9 a11 a13 a15 a17 a19 a21
      const __m128i s7 = _mm_and_si128(_mm_srli_epi16(row0_3, 8), mask_even);

      // a0a7 a2a9 a4a11 .... a12a19 a14a21
      const __m128i s07 = _mm_add_epi16(s0, s7);
      // a1a6 a3a8 a5a10 .... a13a18 a15a20
      const __m128i s16 = _mm_add_epi16(s1, s6);
      // a2a5 a4a7 a6a9  .... a14a17 a16a19
      const __m128i s25 = _mm_add_epi16(s2, s5);
      // a3a4 a5a6 a7a8  .... a15a16 a17a18
      const __m128i s34 = _mm_add_epi16(s3, s4);

      // a0a7 a1a6 a2a9 a3a8 a4a11 a5a10 a6a13 a7a12
      const __m128i s1607_low = _mm_unpacklo_epi16(s07, s16);
      // a2a5 a3a4 a4a7 a5a6 a6a9 a7a8 a8a11 a9a10
      const __m128i s3425_low = _mm_unpacklo_epi16(s25, s34);

      // a8a15 a9a14 a10a17 a11a16 a12a19 a13a18 a14a21 a15a20
      const __m128i s1607_high = _mm_unpackhi_epi16(s07, s16);
      // a10a13 a11a12 a12a15 a13a14 a14a17 a15a16 a16a19 a17a18
      const __m128i s3425_high = _mm_unpackhi_epi16(s25, s34);

      const __m128i r01_0 = _mm_madd_epi16(s3425_low, coeffs_x[1]);
      const __m128i r01_1 = _mm_madd_epi16(s1607_low, coeffs_x[0]);
      const __m128i r01_2 = _mm_madd_epi16(s3425_high, coeffs_x[1]);
      const __m128i r01_3 = _mm_madd_epi16(s1607_high, coeffs_x[0]);

      // Result of first 8 pixels of row0 (a0 to a7).
      // r0_0 r0_1 r0_2 r0_3
      __m128i r00 = _mm_add_epi32(r01_0, r01_1);
      r00 = _mm_add_epi32(r00, round_const_bits);
      r00 = _mm_sra_epi32(r00, round_shift_bits);

      // Result of next 8 pixels of row0 (a8 to 15).
      // r0_4 r0_5 r0_6 r0_7
      __m128i r01 = _mm_add_epi32(r01_2, r01_3);
      r01 = _mm_add_epi32(r01, round_const_bits);
      r01 = _mm_sra_epi32(r01, round_shift_bits);

      // r0_0 r0_1 r1_2 r0_3 r0_4 r0_5 r0_6 r0_7
      const __m128i res_16 = _mm_packs_epi32(r00, r01);
      const __m128i res_8 = _mm_packus_epi16(res_16, res_16);
      __m128i res = _mm_min_epu8(res_8, clip_pixel);
      res = _mm_max_epu8(res, zero);

      // r0_0 r0_1 r1_2 r0_3 r0_4 r0_5 r0_6 r0_7
      _mm_storel_epi64((__m128i *)&intbuf[out_idx], res);
    }

    int wd_processed = filtered_length - remain_col;
    if (remain_col) {
      const int in_idx = (in_stride * i);
      const int out_idx = (wd_processed / 2) + width2 * i;

      down2_symeven(input + in_idx, filtered_length, intbuf + out_idx,
                    wd_processed);
    }
  }
}